

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.cpp
# Opt level: O2

Ptr<Surface> __thiscall
myvk::Surface::Create(Surface *this,Ptr<Instance> *instance,GLFWwindow *window)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  VkResult VVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr<Surface> PVar3;
  shared_ptr<myvk::Surface> ret;
  _func_int **local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  
  std::make_shared<myvk::Surface>();
  std::__shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2> *)(local_38 + 3),
             &instance->super___shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2>);
  local_38[5] = (_func_int *)window;
  VVar2 = glfwCreateWindowSurface
                    (*(VkInstance_conflict *)(local_38[3] + 0x18),window,
                     (VkAllocationCallbacks *)0x0,(VkSurfaceKHR_conflict *)(local_38 + 6));
  _Var1._M_pi = a_Stack_30[0]._M_pi;
  if (VVar2 == VK_SUCCESS) {
    a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_Base)._vptr_Base = local_38;
    (this->super_Base).super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)_Var1._M_pi;
  }
  else {
    (this->super_Base)._vptr_Base = (_func_int **)0x0;
    (this->super_Base).super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_30);
  PVar3.super___shared_ptr<myvk::Surface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar3.super___shared_ptr<myvk::Surface,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<Surface>)PVar3.super___shared_ptr<myvk::Surface,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<Surface> Surface::Create(const Ptr<Instance> &instance, GLFWwindow *window) {
	auto ret = std::make_shared<Surface>();
	ret->m_instance_ptr = instance;
	ret->m_window = window;
	if (glfwCreateWindowSurface(ret->m_instance_ptr->GetHandle(), window, nullptr, &ret->m_surface) != VK_SUCCESS)
		return nullptr;
	return ret;
}